

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O1

int32_t ucnv_toUChars_63(UConverter *cnv,UChar *dest,int32_t destCapacity,char *src,
                        int32_t srcLength,UErrorCode *pErrorCode)

{
  int32_t iVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  char *sourceLimit;
  uint length;
  ulong uVar5;
  UChar *dest_00;
  UChar *dest_local;
  char *src_local;
  UChar *local_840;
  UChar buffer [1024];
  UChar local_38 [4];
  
  iVar1 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (iVar1 = 0, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((destCapacity < 0 || cnv == (UConverter *)0x0) ||
       ((srcLength < -1 || dest == (UChar *)0x0 && 0 < destCapacity ||
        (src == (char *)0x0 && srcLength != 0)))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      iVar1 = 0;
    }
    else {
      dest_local = dest;
      src_local = src;
      _reset(cnv,UCNV_RESET_TO_UNICODE,'\x01');
      dest_00 = dest_local;
      if (srcLength == -1) {
        sVar2 = strlen(src_local);
        srcLength = (int32_t)sVar2;
      }
      if (srcLength < 1) {
        length = 0;
      }
      else {
        sourceLimit = src_local + (uint)srcLength;
        if (0 < destCapacity) {
          lVar4 = 0x1ffffffff;
          if (dest_00 < (UChar *)0xffffffff80000001) {
            lVar4 = (long)dest_00 + 0x7fffffff;
          }
          iVar3 = (int)((ulong)(lVar4 - (long)dest_00) >> 1);
          if (iVar3 < destCapacity) {
            destCapacity = iVar3;
          }
        }
        local_840 = dest_00;
        ucnv_toUnicode_63(cnv,&dest_local,dest_00 + destCapacity,&src_local,sourceLimit,
                          (int32_t *)0x0,'\x01',pErrorCode);
        uVar5 = (ulong)((long)dest_local - (long)local_840) >> 1;
        length = (uint)uVar5;
        dest_00 = local_840;
        if (*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
          do {
            *pErrorCode = U_ZERO_ERROR;
            dest_local = buffer;
            ucnv_toUnicode_63(cnv,&dest_local,local_38,&src_local,sourceLimit,(int32_t *)0x0,'\x01',
                              pErrorCode);
            length = (int)uVar5 + (int)((ulong)((long)dest_local - (long)buffer) >> 1);
            uVar5 = (ulong)length;
            dest_00 = local_840;
          } while (*pErrorCode == U_BUFFER_OVERFLOW_ERROR);
        }
      }
      iVar1 = u_terminateUChars_63(dest_00,destCapacity,length,pErrorCode);
    }
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_toUChars(UConverter *cnv,
              UChar *dest, int32_t destCapacity,
              const char *src, int32_t srcLength,
              UErrorCode *pErrorCode) {
    const char *srcLimit;
    UChar *originalDest, *destLimit;
    int32_t destLength;

    /* check arguments */
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if( cnv==NULL ||
        destCapacity<0 || (destCapacity>0 && dest==NULL) ||
        srcLength<-1 || (srcLength!=0 && src==NULL))
    {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* initialize */
    ucnv_resetToUnicode(cnv);
    originalDest=dest;
    if(srcLength==-1) {
        srcLength=(int32_t)uprv_strlen(src);
    }
    if(srcLength>0) {
        srcLimit=src+srcLength;
        destCapacity=pinCapacity(dest, destCapacity);
        destLimit=dest+destCapacity;

        /* perform the conversion */
        ucnv_toUnicode(cnv, &dest, destLimit, &src, srcLimit, 0, TRUE, pErrorCode);
        destLength=(int32_t)(dest-originalDest);

        /* if an overflow occurs, then get the preflighting length */
        if(*pErrorCode==U_BUFFER_OVERFLOW_ERROR)
        {
            UChar buffer[1024];

            destLimit=buffer+UPRV_LENGTHOF(buffer);
            do {
                dest=buffer;
                *pErrorCode=U_ZERO_ERROR;
                ucnv_toUnicode(cnv, &dest, destLimit, &src, srcLimit, 0, TRUE, pErrorCode);
                destLength+=(int32_t)(dest-buffer);
            }
            while(*pErrorCode==U_BUFFER_OVERFLOW_ERROR);
        }
    } else {
        destLength=0;
    }

    return u_terminateUChars(originalDest, destCapacity, destLength, pErrorCode);
}